

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::toDecNum
          (DecimalQuantity *this,DecNum *output,UErrorCode *status)

{
  int length;
  uchar uVar1;
  int32_t m;
  int position;
  int iVar2;
  MaybeStackArray<unsigned_char,_20> ubcd;
  
  iVar2 = this->precision;
  if (iVar2 == 0) {
    DecNum::setTo(output,"0",status);
    iVar2 = this->precision;
  }
  MaybeStackArray<unsigned_char,_20>::MaybeStackArray(&ubcd,iVar2);
  iVar2 = -1;
  for (position = 0; length = this->precision, position < length; position = position + 1) {
    uVar1 = getDigitPos(this,position);
    ubcd.ptr[length + iVar2] = uVar1;
    iVar2 = iVar2 + -1;
  }
  DecNum::setTo(output,ubcd.ptr,length,this->scale,(bool)(this->flags & 1),status);
  MaybeStackArray<unsigned_char,_20>::~MaybeStackArray(&ubcd);
  return;
}

Assistant:

void DecimalQuantity::toDecNum(DecNum& output, UErrorCode& status) const {
    // Special handling for zero
    if (precision == 0) {
        output.setTo("0", status);
    }

    // Use the BCD constructor. We need to do a little bit of work to convert, though.
    // The decNumber constructor expects most-significant first, but we store least-significant first.
    MaybeStackArray<uint8_t, 20> ubcd(precision);
    for (int32_t m = 0; m < precision; m++) {
        ubcd[precision - m - 1] = static_cast<uint8_t>(getDigitPos(m));
    }
    output.setTo(ubcd.getAlias(), precision, scale, isNegative(), status);
}